

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O0

void __thiscall OpenMD::NVT::doUpdateSizes(NVT *this)

{
  size_type in_RDI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *unaff_retaddr;
  size_type __new_size;
  
  __new_size = in_RDI;
  SimInfo::getNIntegrableObjects(*(SimInfo **)(in_RDI + 0x70));
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (unaff_retaddr,__new_size);
  SimInfo::getNIntegrableObjects(*(SimInfo **)(in_RDI + 0x70));
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (unaff_retaddr,__new_size);
  return;
}

Assistant:

void NVT::doUpdateSizes() {
    oldVel_.resize(info_->getNIntegrableObjects());
    oldJi_.resize(info_->getNIntegrableObjects());
  }